

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void ossaddsb(osgen_txtwin_t *win,char *p,size_t len,int draw)

{
  int iVar1;
  int y;
  int iVar2;
  char *pcVar3;
  int in_ECX;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  int line_len;
  int starty;
  int startx;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  osgen_txtwin_t *in_stack_ffffffffffffffd0;
  int iVar4;
  long local_18;
  char *local_10;
  
  if (*(long *)(in_RDI + 0x80) != 0) {
    iVar1 = *(int *)(in_RDI + 0x48) - *(int *)(in_RDI + 0x58);
    y = *(int *)(in_RDI + 0x4c) - *(int *)(in_RDI + 0x5c);
    iVar4 = 0;
    local_18 = in_RDX;
    local_10 = in_RSI;
    while (local_18 != 0) {
      in_stack_ffffffffffffffd0 = (osgen_txtwin_t *)(ulong)((int)*local_10 - 1);
      switch(in_stack_ffffffffffffffd0) {
      case (osgen_txtwin_t *)0x0:
        *(uint *)(in_RDI + 100) = (uint)(byte)local_10[1];
        if (*(int *)(in_RDI + 0x48) == 0) {
          *(undefined4 *)(in_RDI + 0x78) = *(undefined4 *)(in_RDI + 100);
        }
        osssb_add_bytes((osgen_txtwin_t *)CONCAT44(y,iVar4),(char *)in_stack_ffffffffffffffd0,
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        local_10 = local_10 + 2;
        local_18 = local_18 + -2;
        break;
      case (osgen_txtwin_t *)0x1:
        *(char *)(in_RDI + 0x60) = local_10[1];
        *(char *)(in_RDI + 0x61) = local_10[2];
        if (*(int *)(in_RDI + 0x48) == 0) {
          *(int *)(in_RDI + 0x70) = (int)*(char *)(in_RDI + 0x60);
          *(int *)(in_RDI + 0x74) = (int)*(char *)(in_RDI + 0x61);
        }
        osssb_add_bytes((osgen_txtwin_t *)CONCAT44(y,iVar4),(char *)in_stack_ffffffffffffffd0,
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        local_10 = local_10 + 3;
        local_18 = local_18 + -3;
        break;
      default:
        iVar2 = osssb_add_byte((osgen_txtwin_t *)CONCAT44(y,iVar4),'\0');
        if (iVar2 != 0) {
          if (*(int *)(in_RDI + 0x50) < *(int *)(in_RDI + 0x48)) {
            *(undefined4 *)(in_RDI + 0x50) = *(undefined4 *)(in_RDI + 0x48);
          }
          *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + 1;
          iVar4 = iVar4 + 1;
        }
        local_10 = local_10 + 1;
        local_18 = local_18 + -1;
        break;
      case (osgen_txtwin_t *)0x9:
        osssb_new_line((osgen_txtwin_t *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        if (in_ECX != 0) {
          osgen_scrdisp(&in_stack_ffffffffffffffd0->base,in_stack_ffffffffffffffcc,
                        in_stack_ffffffffffffffc8,0);
        }
        local_10 = local_10 + 1;
        local_18 = local_18 + -1;
        iVar1 = *(int *)(in_RDI + 0x48) - *(int *)(in_RDI + 0x58);
        y = y + 1;
        iVar4 = 0;
        if (in_ECX != 0) {
          osgen_auto_vscroll((osgen_txtwin_t *)0x223294);
        }
        break;
      case (osgen_txtwin_t *)0xc:
        pcVar3 = osgen_get_line((osgen_txtwin_t *)CONCAT44(in_ECX,iVar1),y);
        *(char **)(in_RDI + 0x90) = pcVar3;
        *(char *)(in_RDI + 0x60) = (char)*(undefined4 *)(in_RDI + 0x70);
        *(char *)(in_RDI + 0x61) = (char)*(undefined4 *)(in_RDI + 0x74);
        *(undefined4 *)(in_RDI + 100) = *(undefined4 *)(in_RDI + 0x78);
        osssb_add_color_code(in_stack_ffffffffffffffd0);
        if (((in_ECX != 0) && (-1 < y)) && (y < (int)*(undefined8 *)(in_RDI + 0x40))) {
          ossclr((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0);
        }
        iVar4 = 0;
        iVar1 = 0;
        *(undefined4 *)(in_RDI + 0x48) = 0;
        local_10 = local_10 + 1;
        local_18 = local_18 + -1;
      }
    }
    osssb_add_safety_null((osgen_txtwin_t *)0x223414);
    if (in_ECX != 0) {
      osgen_scrdisp(&in_stack_ffffffffffffffd0->base,in_stack_ffffffffffffffcc,
                    in_stack_ffffffffffffffc8,0);
      osgen_auto_vscroll((osgen_txtwin_t *)0x22343b);
    }
  }
  return;
}

Assistant:

static void ossaddsb(osgen_txtwin_t *win, const char *p, size_t len, int draw)
{
    int startx;
    int starty;
    int line_len;

    /* if there's no scrollback buffer, ignore it */
    if (win->txtbuf == 0)
        return;

    /* note the starting x,y position, for redrawing purposes */
    startx = win->base.x - win->base.scrollx;
    starty = win->base.y - win->base.scrolly;

    /* we haven't added any characters to the line yet */
    line_len = 0;

    /*
     *   Copy the text into the screen buffer, respecting the circular
     *   nature of the screen buffer.  If the given text wraps lines,
     *   enter an explicit carriage return into the text to ensure that
     *   users can correctly count lines.
     */
    while (len != 0)
    {
        /* check what we have */
        switch(*p)
        {
        case OSGEN_ATTR:
            /* switch to the new attributes */
            win->base.txtattr = (unsigned char)*(p+1);

            /* 
             *   if we're at the start of the line, this is the start-of-line
             *   attribute - this will ensure that if we back up with '\r',
             *   we'll re-apply this attribute change 
             */
            if (win->base.x == 0)
                win->solattr = win->base.txtattr;

            /* add the two-byte sequence */
            osssb_add_bytes(win, p, 2);
            p += 2;
            len -= 2;
            break;

        case OSGEN_COLOR:
            /* switch to the new colors */
            win->base.txtfg = (unsigned char)*(p+1);
            win->base.txtbg = (unsigned char)*(p+2);

            /* 
             *   if we're at the start of the line, this is the new
             *   start-of-line color 
             */
            if (win->base.x == 0)
            {
                win->solfg = win->base.txtfg;
                win->solbg = win->base.txtbg;
            }

            /* add and skip the three-byte color sequence */
            osssb_add_bytes(win, p, 3);
            p += 3;
            len -= 3;
            break;
            
        case '\n':
            /* add the new line */
            osssb_new_line(win);

            /* draw the part of the line we added */
            if (draw)
                osgen_scrdisp(&win->base, startx, starty, line_len);

            /* skip this character */
            ++p;
            --len;

            /* reset to the next line */
            startx = win->base.x - win->base.scrollx;
            ++starty;
            line_len = 0;

            /* bring the cursor onto the screen if auto-vscrolling */
            if (draw)
                osgen_auto_vscroll(win);

            /* done */
            break;

        case '\r':
            /*
             *   We have a plain carriage return, which indicates that we
             *   should go back to the start of the current line and
             *   overwrite it.  (This is most likely to occur for the
             *   "[More]" prompt.)
             */

            /* set the free pointer back to the start of the current line */
            win->txtfree = osgen_get_line(win, win->base.y);

            /* switch back to the color as of the start of the line */
            win->base.txtfg = win->solfg;
            win->base.txtbg = win->solbg;
            win->base.txtattr = win->solattr;

            /* 
             *   since we're back at the start of the line, add a color code
             *   if necessary 
             */
            osssb_add_color_code(win);

            /* clear the window area of the line we're overwriting */
            if (draw && starty >= 0 && starty < (int)win->base.ht)
                ossclr(win->base.winy + starty, win->base.winx,
                       win->base.winy + starty,
                       win->base.winx + win->base.wid - 1,
                       win->base.oss_fillcolor);

            /* reset to the start of the line */
            line_len = 0;
            startx = 0;

            /* move to the left column */
            win->base.x = 0;

            /* skip this character */
            ++p;
            --len;

            /* done */
            break;

        default:
            /* for anything else, simply store the byte in the buffer */
            if (osssb_add_byte(win, *p))
            {
                /* note the maximum output position if appropriate */
                if (win->base.x > win->base.xmax)
                    win->base.xmax = win->base.x;

                /* adjust the output x position */
                win->base.x++;

                /* count the ordinary character in the display length */
                ++line_len;
            }
            
            /* skip the character */
            ++p;
            --len;
                
            /* done */
            break;
        }
    }

    /* 
     *   Add a safety null terminator after each addition, in case we need
     *   to look at the buffer before this line is finished.  
     */
    osssb_add_safety_null(win);

    /* display the added text */
    if (draw)
    {
        /* show the added text */
        osgen_scrdisp(&win->base, startx, starty, line_len);

        /* bring the cursor onto the screen if auto-vscrolling */
        osgen_auto_vscroll(win);
    }
}